

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int type)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  undefined4 in_R8D;
  Mat m;
  Mat *this_00;
  undefined1 local_68 [16];
  Allocator *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  Mat *in_stack_ffffffffffffffb8;
  
  this_00 = in_RDI;
  (**(code **)(*in_RSI + 0x10))(local_68,in_RSI,in_EDX * in_ECX,in_R8D);
  bVar1 = ncnn::Mat::empty(this_00);
  if (bVar1) {
    ncnn::Mat::Mat(this_00,in_RDI);
  }
  else {
    ncnn::Mat::reshape(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0
                       ,in_stack_ffffffffffffffa8);
  }
  ncnn::Mat::~Mat((Mat *)0x158f09);
  return this_00;
}

Assistant:

Mat ModelBin::load(int w, int h, int type) const
{
    Mat m = load(w * h, type);
    if (m.empty())
        return m;

    return m.reshape(w, h);
}